

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::LoadFloatConstant(VirtualMachine *this)

{
  size_t sVar1;
  element_type *peVar2;
  size_type sVar3;
  const_reference pvVar4;
  allocator<char> local_39;
  string local_38;
  size_t local_18;
  size_t index;
  VirtualMachine *this_local;
  
  index = (size_t)this;
  sVar1 = getByteCodeParameter(this);
  local_18 = sVar1;
  peVar2 = std::
           __shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->file);
  sVar3 = std::vector<double,_std::allocator<double>_>::size(&peVar2->floatConstants);
  if (sVar3 <= sVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Index out of bounds in LoadFloatConstant",&local_39);
    panic(this,&local_38);
  }
  peVar2 = std::
           __shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->file);
  pvVar4 = std::vector<double,_std::allocator<double>_>::at(&peVar2->floatConstants,local_18);
  pushFloat(this,*pvVar4);
  advance(this);
  return;
}

Assistant:

void runtime::VirtualMachine::LoadFloatConstant() {
  std::size_t index = this->getByteCodeParameter();

  if (index >= this->file->floatConstants.size()) {
    this->panic("Index out of bounds in LoadFloatConstant");
    return;
  }

  this->pushFloat(this->file->floatConstants.at(index));

  this->advance();
}